

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cc
# Opt level: O0

int main(int argc,char **argv)

{
  anon_class_16_2_b594b5b4_for_callback_ callback;
  TestingPortal *pTVar1;
  undefined8 *puVar2;
  long *plVar3;
  void *pvVar4;
  size_t sVar5;
  FILE *pFVar6;
  char *in_RCX;
  string_view sVar7;
  string_view base_template;
  string_view local_110;
  string_view local_100;
  string_view local_f0;
  string local_e0 [8];
  string s;
  undefined1 local_b0 [8];
  Cleanup<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_alk[P]gperftools_src_tests_sampling_test_cc:187:34)>
  unlink_temps;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  undefined1 local_80 [8];
  TempFile growth_tmp;
  size_t local_50;
  undefined1 local_48 [8];
  TempFile heap_tmp;
  int i;
  char **argv_local;
  int argc_local;
  
  pTVar1 = tcmalloc::TestingPortal::Get();
  puVar2 = (undefined8 *)(**(code **)(*(long *)pTVar1 + 0x28))();
  *puVar2 = 0x80000;
  plVar3 = (long *)MallocExtension::instance();
  (**(code **)(*plVar3 + 0x68))();
  for (heap_tmp.path.field_2._12_4_ = 0; (int)heap_tmp.path.field_2._12_4_ < 8000;
      heap_tmp.path.field_2._12_4_ = heap_tmp.path.field_2._12_4_ + 1) {
    AllocateAllocate();
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             ((long)&growth_tmp.path.field_2 + 8),"sampling_test.heap.XXXXXX");
  sVar7._M_str = in_RCX;
  sVar7._M_len = local_50;
  TempFile::Create((TempFile *)local_48,(TempFile *)growth_tmp.path.field_2._8_8_,sVar7);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_90,"sampling_test.growth.XXXXXX");
  base_template._M_str = in_RCX;
  base_template._M_len = (size_t)local_90._M_str;
  TempFile::Create((TempFile *)local_80,(TempFile *)local_90._M_len,base_template);
  s.field_2._8_8_ = local_48;
  callback.growth_tmp = (TempFile *)local_80;
  callback.heap_tmp = (TempFile *)s.field_2._8_8_;
  tcmalloc::
  Cleanup<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/sampling_test.cc:187:34)>
  ::Cleanup((Cleanup<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_alk[P]gperftools_src_tests_sampling_test_cc:187:34)>
             *)local_b0,callback);
  std::__cxx11::string::string(local_e0);
  plVar3 = (long *)MallocExtension::instance();
  (**(code **)(*plVar3 + 0x40))(plVar3,local_e0);
  pvVar4 = (void *)std::__cxx11::string::data();
  sVar5 = std::__cxx11::string::size();
  fwrite(pvVar4,1,sVar5,(FILE *)local_48);
  pFVar6 = (FILE *)TempFile::ReleaseFile((TempFile *)local_48);
  fclose(pFVar6);
  std::__cxx11::string::clear();
  plVar3 = (long *)MallocExtension::instance();
  (**(code **)(*plVar3 + 0x48))(plVar3,local_e0);
  pvVar4 = (void *)std::__cxx11::string::data();
  sVar5 = std::__cxx11::string::size();
  fwrite(pvVar4,1,sVar5,(FILE *)local_80);
  pFVar6 = (FILE *)TempFile::ReleaseFile((TempFile *)local_80);
  fclose(pFVar6);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f0,*argv);
  local_100 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&heap_tmp);
  VerifyWithPProf(local_f0,local_100);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_110,*argv);
  sVar7 = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)&growth_tmp);
  VerifyWithPProf(local_110,sVar7);
  std::__cxx11::string::~string(local_e0);
  tcmalloc::
  Cleanup<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/sampling_test.cc:187:34)>
  ::~Cleanup((Cleanup<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_alk[P]gperftools_src_tests_sampling_test_cc:187:34)>
              *)local_b0);
  TempFile::~TempFile((TempFile *)local_80);
  TempFile::~TempFile((TempFile *)local_48);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  tcmalloc::TestingPortal::Get()->GetSampleParameter() = 512 << 10;
  // Make sure allocations we sample are done on fresh thread cache, so that
  // sampling parameter update is taken into account.
  MallocExtension::instance()->MarkThreadIdle();

  for (int i = 0; i < 8000; i++) {
    AllocateAllocate();
  }

  TempFile heap_tmp = TempFile::Create("sampling_test.heap.XXXXXX");
  TempFile growth_tmp = TempFile::Create("sampling_test.growth.XXXXXX");
  tcmalloc::Cleanup unlink_temps{[&] () {
    (void)unlink(heap_tmp.path.c_str());
    (void)unlink(growth_tmp.path.c_str());
  }};

  std::string s;
  MallocExtension::instance()->GetHeapSample(&s);
  fwrite(s.data(), 1, s.size(), heap_tmp.f);
  fclose(heap_tmp.ReleaseFile());

  s.clear();
  MallocExtension::instance()->GetHeapGrowthStacks(&s);
  fwrite(s.data(), 1, s.size(), growth_tmp.f);
  fclose(growth_tmp.ReleaseFile());

  VerifyWithPProf(argv[0], heap_tmp.path);
  VerifyWithPProf(argv[0], growth_tmp.path);
}